

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O2

void __thiscall kj::ThreadId::assertCurrentThread(ThreadId *this)

{
  long *in_FS_OFFSET;
  Fault f;
  DebugComparison<void_*const_&,_bool_*> _kjCondition;
  
  _kjCondition.right = (bool *)(*in_FS_OFFSET + -0x18);
  _kjCondition.result = (bool *)this->id == _kjCondition.right;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    return;
  }
  _kjCondition.left = &this->id;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<void*const&,bool*>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.c++"
             ,0x36,FAILED,"id == &currentThreadId","_kjCondition,",&_kjCondition);
  _::Debug::Fault::fatal(&f);
}

Assistant:

void ThreadId::assertCurrentThread() const { KJ_ASSERT(id == &currentThreadId); }